

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall
GslSpan_CopyMoveAndAssignment_Test::TestBody(GslSpan_CopyMoveAndAssignment_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_200;
  Message local_1f8;
  int *local_1f0;
  pointer local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_3;
  Message local_1c8;
  int local_1bc;
  index_type local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_2;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_190;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_180;
  anon_class_8_1_ba1d35c1 local_170;
  anon_class_8_1_ba1d35c1 use_span;
  anon_class_8_1_ba1d35c1 get_temp_span;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_108;
  Message local_100;
  element_type *local_f8;
  pointer local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  int local_c4;
  index_type local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  span<const_int,__1L> s2;
  element_type local_90;
  undefined1 auStack_8c [4];
  int arr [3];
  AssertHelper local_60;
  Message local_58 [3];
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  span<int,__1L> s1;
  GslSpan_CopyMoveAndAssignment_Test *this_local;
  
  pstore::gsl::span<int,_-1L>::span((span<int,__1L> *)&gtest_ar_.message_);
  local_39 = pstore::gsl::span<int,_-1L>::empty((span<int,__1L> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(arr + 2),(internal *)local_38,(AssertionResult *)"s1.empty ()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2dc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)(arr + 2));
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_90 = 3;
  auStack_8c = (undefined1  [4])0x4;
  arr[0] = 5;
  pstore::gsl::span<int_const,-1l>::span<3ul>
            ((span<int_const,_1l> *)&gtest_ar.message_,(element_type (*) [3])&local_90);
  local_c0 = pstore::gsl::span<const_int,_-1L>::length((span<const_int,__1L> *)&gtest_ar.message_);
  local_c4 = 3;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_b8,"s2.length ()","3",&local_c0,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2e1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_f0 = pstore::gsl::span<const_int,_-1L>::data((span<const_int,__1L> *)&gtest_ar.message_);
  local_f8 = &local_90;
  testing::internal::EqHelper::Compare<const_int_*,_int_*,_nullptr>
            ((EqHelper *)local_e8,"s2.data ()","&arr[0]",&local_f0,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2e2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  pstore::gsl::span<int_const,-1l>::span<int,_1l>
            ((span<int_const,_1l> *)&gtest_ar__1.message_,(span<int,__1L> *)&gtest_ar_.message_);
  gtest_ar.message_ = gtest_ar__1.message_;
  local_129 = pstore::gsl::span<const_int,_-1L>::empty((span<const_int,__1L> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&get_temp_span,(internal *)local_128,(AssertionResult *)"s2.empty ()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2e5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&get_temp_span);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_170.arr = (int (*) [3])&local_90;
  use_span.arr = local_170.arr;
  local_190 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              TestBody::anon_class_8_1_ba1d35c1::operator()(&use_span);
  pstore::gsl::span<int_const,-1l>::span<int,_1l>
            ((span<int_const,_1l> *)&local_180,(span<int,__1L> *)&local_190);
  TestBody::anon_class_8_1_ba1d35c1::operator()(&local_170,(span<const_int,__1L>)local_180);
  join_0x00000010_0x00000000_ =
       (storage_type<pstore::gsl::details::extent_type<_1L>_>)
       TestBody::anon_class_8_1_ba1d35c1::operator()(&use_span);
  gtest_ar_.message_ = gtest_ar_2.message_;
  local_1b8 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar_.message_);
  local_1bc = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1b0,"s1.length ()","2",&local_1b8,&local_1bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1e8 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar_.message_);
  local_1f0 = (int *)auStack_8c;
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_1e0,"s1.data ()","&arr[1]",&local_1e8,&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x2f0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  return;
}

Assistant:

TEST (GslSpan, CopyMoveAndAssignment) {
    span<int> s1;
    EXPECT_TRUE (s1.empty ());

    int arr[] = {3, 4, 5};

    auto s2 = span<int const>{arr};
    EXPECT_EQ (s2.length (), 3);
    EXPECT_EQ (s2.data (), &arr[0]);

    s2 = s1;
    EXPECT_TRUE (s2.empty ());

    auto get_temp_span = [&] () -> span<int> { return {&arr[1], 2}; };
    auto use_span = [&] (span<int const> s) {
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[1]);
    };
    use_span (get_temp_span ());

    s1 = get_temp_span ();
    EXPECT_EQ (s1.length (), 2);
    EXPECT_EQ (s1.data (), &arr[1]);
}